

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exampleAttributeTranslation.cpp
# Opt level: O2

void printObject(Builder *b)

{
  ostream *poVar1;
  string_view sVar2;
  undefined1 local_b0 [16];
  Slice s;
  ObjectIterator __begin1;
  string local_70;
  ObjectIterator local_50;
  
  s._start = arangodb::velocypack::Builder::start(b);
  poVar1 = std::operator<<((ostream *)&std::cout,"Slice: ");
  poVar1 = arangodb::velocypack::operator<<(poVar1,&s);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Type: ");
  poVar1 = operator<<(poVar1,arangodb::velocypack::SliceStaticData::TypeMap[*s._start]);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Bytesize: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
  byteSize((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Members: ");
  arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::length
            ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)&s);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::endl<char,std::char_traits<char>>(poVar1);
  poVar1 = std::operator<<((ostream *)&std::cout,"Iterating Object members:");
  std::endl<char,std::char_traits<char>>(poVar1);
  arangodb::velocypack::ObjectIterator::ObjectIterator(&local_50,s,true);
  __begin1._size = local_50._size;
  __begin1._position = local_50._position;
  __begin1._slice._start = local_50._slice._start;
  __begin1._current = local_50._current;
  while (__begin1._position != __begin1._size) {
    local_b0 = (undefined1  [16])arangodb::velocypack::ObjectIterator::operator*(&__begin1);
    poVar1 = std::operator<<((ostream *)&std::cout,"key: ");
    sVar2 = arangodb::velocypack::
            SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::stringView
                      ((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *)
                       local_b0);
    poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,sVar2._M_str,sVar2._M_len);
    poVar1 = std::operator<<(poVar1,", value: ");
    arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice>::
    toJson_abi_cxx11_(&local_70,
                      (SliceBase<arangodb::velocypack::Slice,arangodb::velocypack::Slice> *)
                      (local_b0 + 8),&arangodb::velocypack::Options::Defaults);
    poVar1 = std::operator<<(poVar1,(string *)&local_70);
    std::endl<char,std::char_traits<char>>(poVar1);
    std::__cxx11::string::~string((string *)&local_70);
    arangodb::velocypack::ObjectIterator::next(&__begin1);
  }
  return;
}

Assistant:

static void printObject(Builder const& b) {
  // a Slice is a lightweight accessor for a VPack value
  Slice s(b.start());

  // inspect the outermost value (should be an Object...)
  std::cout << "Slice: " << s << std::endl;
  std::cout << "Type: " << s.type() << std::endl;
  std::cout << "Bytesize: " << s.byteSize() << std::endl;
  std::cout << "Members: " << s.length() << std::endl;

  // now iterate over the object members
  // the attribute name translator works transparently
  std::cout << "Iterating Object members:" << std::endl;
  for (auto const& it : ObjectIterator(s, /*useSequentialIteration*/ true)) {
    std::cout << "key: " << it.key.stringView()
              << ", value: " << it.value.toJson() << std::endl;
  }
}